

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

uint8_t * google::protobuf::internal::SerializeInternalToArray
                    (uint8_t *base,FieldMetadata *field_metadata_table,int32_t num_fields,
                    bool is_deterministic,uint8_t *buffer)

{
  FieldMetadata *md;
  float fVar1;
  pointer pcVar2;
  bool bVar3;
  int64_t iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  string *str;
  uint32_t *has_bits_array;
  ArrayOutput array_output;
  CodedOutputStream output_stream;
  ArrayOutputStream array_stream;
  ArrayOutput local_b0;
  CodedOutputStream local_a0;
  ArrayOutputStream local_50;
  
  local_b0.ptr = buffer;
  if (0 < num_fields) {
    uVar10 = 0;
    local_b0.is_deterministic = is_deterministic;
    do {
      uVar8 = field_metadata_table[uVar10].type;
      if (uVar8 < 0x6a) {
        md = field_metadata_table + uVar10;
        str = (string *)(base + md->offset);
        switch(uVar8) {
        case 0:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
LAB_0031b882:
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
LAB_0031bb8f:
            *(pointer *)pbVar9 = (str->_M_dataplus)._M_p;
            local_b0.ptr = pbVar9 + 8;
          }
          break;
        case 1:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
LAB_0031b9cf:
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
LAB_0031b9d5:
            *(undefined4 *)pbVar9 = *(undefined4 *)&(str->_M_dataplus)._M_p;
            local_b0.ptr = pbVar9 + 4;
          }
          break;
        case 2:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            pcVar2 = (str->_M_dataplus)._M_p;
            *pbVar9 = (byte)pcVar2;
            if (pcVar2 < (pointer)0x80) {
LAB_0031c6b4:
              local_b0.ptr = pbVar9 + 1;
            }
            else {
              *pbVar9 = (byte)pcVar2 | 0x80;
              pbVar9[1] = (byte)((ulong)pcVar2 >> 7);
              local_b0.ptr = pbVar9 + 2;
              if ((pointer)0x3fff < pcVar2) {
                uVar11 = (ulong)pbVar9[1];
                uVar7 = (ulong)pcVar2 >> 7;
                do {
                  local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                  uVar5 = uVar7 >> 7;
                  *local_b0.ptr = (byte)uVar5;
                  local_b0.ptr = local_b0.ptr + 1;
                  uVar11 = uVar5 & 0xffffffff;
                  bVar3 = 0x3fff < uVar7;
                  uVar7 = uVar5;
                } while (bVar3);
              }
            }
          }
          break;
        case 3:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            pcVar2 = (str->_M_dataplus)._M_p;
            *pbVar9 = (byte)pcVar2;
            if (pcVar2 < (pointer)0x80) goto LAB_0031c6b4;
            *pbVar9 = (byte)pcVar2 | 0x80;
            pbVar9[1] = (byte)((ulong)pcVar2 >> 7);
            local_b0.ptr = pbVar9 + 2;
            if ((pointer)0x3fff < pcVar2) {
              uVar11 = (ulong)pbVar9[1];
              uVar7 = (ulong)pcVar2 >> 7;
              do {
                local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                uVar5 = uVar7 >> 7;
                *local_b0.ptr = (byte)uVar5;
                local_b0.ptr = local_b0.ptr + 1;
                uVar11 = uVar5 & 0xffffffff;
                bVar3 = 0x3fff < uVar7;
                uVar7 = uVar5;
              } while (bVar3);
            }
          }
          break;
        case 4:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            uVar8 = *(uint *)&(str->_M_dataplus)._M_p;
            *pbVar9 = (byte)uVar8;
            if ((ulong)(long)(int)uVar8 < 0x80) {
LAB_0031c79b:
              local_b0.ptr = pbVar9 + 1;
            }
            else {
              *pbVar9 = (byte)uVar8 | 0x80;
              uVar7 = (ulong)(long)(int)uVar8 >> 7;
              pbVar9[1] = (byte)uVar7;
              local_b0.ptr = pbVar9 + 2;
              if (0x3fff < uVar8) {
                uVar11 = (ulong)pbVar9[1];
                do {
                  local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                  uVar5 = uVar7 >> 7;
                  *local_b0.ptr = (byte)uVar5;
                  local_b0.ptr = local_b0.ptr + 1;
                  uVar11 = uVar5 & 0xffffffff;
                  bVar3 = 0x3fff < uVar7;
                  uVar7 = uVar5;
                } while (bVar3);
              }
            }
          }
          break;
        case 5:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b882;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031bb8f;
          }
          break;
        case 6:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b9cf;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031b9d5;
          }
          break;
        case 7:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
LAB_0031b10e:
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
LAB_0031b114:
            *pbVar9 = *(byte *)&(str->_M_dataplus)._M_p;
            local_b0.ptr = pbVar9 + 1;
          }
          break;
        case 8:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
LAB_0031ba20:
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
LAB_0031ba26:
            str = (string *)((ulong)(str->_M_dataplus)._M_p & 0xfffffffffffffffe);
LAB_0031ba32:
            local_b0.ptr = pbVar9;
            local_b0.ptr = io::CodedOutputStream::WriteStringWithSizeToArray(str,pbVar9);
          }
          break;
        case 9:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
LAB_0031b15d:
            SingularFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                      (str,md,&local_b0);
          }
          break;
        case 10:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
LAB_0031b33a:
            SingularFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                      (str,md,&local_b0);
          }
          break;
        case 0xb:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031ba20;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031ba26;
          }
          break;
        case 0xc:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            uVar8 = *(uint *)&(str->_M_dataplus)._M_p;
            *pbVar9 = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031c6b4;
            *pbVar9 = (byte)uVar8 | 0x80;
            pbVar9[1] = (byte)(uVar8 >> 7);
            local_b0.ptr = pbVar9 + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)pbVar9[1];
              uVar8 = uVar8 >> 7;
              do {
                local_b0.ptr[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *local_b0.ptr = (byte)uVar6;
                local_b0.ptr = local_b0.ptr + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
          }
          break;
        case 0xd:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            uVar8 = *(uint *)&(str->_M_dataplus)._M_p;
            *pbVar9 = (byte)uVar8;
            if ((ulong)(long)(int)uVar8 < 0x80) goto LAB_0031c79b;
            *pbVar9 = (byte)uVar8 | 0x80;
            uVar7 = (ulong)(long)(int)uVar8 >> 7;
            pbVar9[1] = (byte)uVar7;
            local_b0.ptr = pbVar9 + 2;
            if (0x3fff < uVar8) {
              uVar11 = (ulong)pbVar9[1];
              do {
                local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                uVar5 = uVar7 >> 7;
                *local_b0.ptr = (byte)uVar5;
                local_b0.ptr = local_b0.ptr + 1;
                uVar11 = uVar5 & 0xffffffff;
                bVar3 = 0x3fff < uVar7;
                uVar7 = uVar5;
              } while (bVar3);
            }
          }
          break;
        case 0xe:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b9cf;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031b9d5;
          }
          break;
        case 0xf:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b882;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031bb8f;
          }
          break;
        case 0x10:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
LAB_0031ba6c:
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
LAB_0031ba72:
            local_b0.ptr = pbVar9;
            local_b0.ptr = PrimitiveTypeHelper<17>::SerializeToArray(str,pbVar9);
          }
          break;
        case 0x11:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
LAB_0031b8b9:
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
LAB_0031b8bf:
            local_b0.ptr = pbVar9;
            local_b0.ptr = PrimitiveTypeHelper<18>::SerializeToArray(str,pbVar9);
          }
          break;
        default:
          goto switchD_0031a8eb_caseD_12;
        case 0x14:
          if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) !=
              0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
LAB_0031b6c0:
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            goto LAB_0031ba32;
          }
          break;
        case 0x15:
          pcVar2 = (str->_M_dataplus)._M_p;
          if (((double)pcVar2 != 0.0) || (NAN((double)pcVar2))) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b882;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031bb8f;
          }
          break;
        case 0x16:
          fVar1 = *(float *)&(str->_M_dataplus)._M_p;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b9cf;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031b9d5;
          }
          break;
        case 0x17:
          if ((str->_M_dataplus)._M_p != (pointer)0x0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            pcVar2 = (str->_M_dataplus)._M_p;
            *pbVar9 = (byte)pcVar2;
            if (pcVar2 < (pointer)0x80) goto LAB_0031c6b4;
            *pbVar9 = (byte)pcVar2 | 0x80;
            pbVar9[1] = (byte)((ulong)pcVar2 >> 7);
            local_b0.ptr = pbVar9 + 2;
            if ((pointer)0x3fff < pcVar2) {
              uVar11 = (ulong)pbVar9[1];
              uVar7 = (ulong)pcVar2 >> 7;
              do {
                local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                uVar5 = uVar7 >> 7;
                *local_b0.ptr = (byte)uVar5;
                local_b0.ptr = local_b0.ptr + 1;
                uVar11 = uVar5 & 0xffffffff;
                bVar3 = 0x3fff < uVar7;
                uVar7 = uVar5;
              } while (bVar3);
            }
          }
          break;
        case 0x18:
          if ((str->_M_dataplus)._M_p != (pointer)0x0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            pcVar2 = (str->_M_dataplus)._M_p;
            *pbVar9 = (byte)pcVar2;
            if (pcVar2 < (pointer)0x80) goto LAB_0031c6b4;
            *pbVar9 = (byte)pcVar2 | 0x80;
            pbVar9[1] = (byte)((ulong)pcVar2 >> 7);
            local_b0.ptr = pbVar9 + 2;
            if ((pointer)0x3fff < pcVar2) {
              uVar11 = (ulong)pbVar9[1];
              uVar7 = (ulong)pcVar2 >> 7;
              do {
                local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                uVar5 = uVar7 >> 7;
                *local_b0.ptr = (byte)uVar5;
                local_b0.ptr = local_b0.ptr + 1;
                uVar11 = uVar5 & 0xffffffff;
                bVar3 = 0x3fff < uVar7;
                uVar7 = uVar5;
              } while (bVar3);
            }
          }
          break;
        case 0x19:
          if (*(int *)&(str->_M_dataplus)._M_p != 0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            uVar8 = *(uint *)&(str->_M_dataplus)._M_p;
            *pbVar9 = (byte)uVar8;
            if ((ulong)(long)(int)uVar8 < 0x80) goto LAB_0031c79b;
            *pbVar9 = (byte)uVar8 | 0x80;
            uVar7 = (ulong)(long)(int)uVar8 >> 7;
            pbVar9[1] = (byte)uVar7;
            local_b0.ptr = pbVar9 + 2;
            if (0x3fff < uVar8) {
              uVar11 = (ulong)pbVar9[1];
              do {
                local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                uVar5 = uVar7 >> 7;
                *local_b0.ptr = (byte)uVar5;
                local_b0.ptr = local_b0.ptr + 1;
                uVar11 = uVar5 & 0xffffffff;
                bVar3 = 0x3fff < uVar7;
                uVar7 = uVar5;
              } while (bVar3);
            }
          }
          break;
        case 0x1a:
          if ((str->_M_dataplus)._M_p != (pointer)0x0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b882;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031bb8f;
          }
          break;
        case 0x1b:
          if (*(int *)&(str->_M_dataplus)._M_p != 0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b9cf;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031b9d5;
          }
          break;
        case 0x1c:
          if (*(uint8_t *)&(str->_M_dataplus)._M_p != '\0') {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b10e;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031b114;
          }
          break;
        case 0x1d:
          if (*(long *)(((ulong)(str->_M_dataplus)._M_p & 0xfffffffffffffffe) + 8) != 0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031ba20;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031ba26;
          }
          break;
        case 0x1e:
          if ((str->_M_dataplus)._M_p != (pointer)0x0) goto LAB_0031b15d;
          break;
        case 0x1f:
          if ((str->_M_dataplus)._M_p != (pointer)0x0) goto LAB_0031b33a;
          break;
        case 0x20:
          if (*(long *)(((ulong)(str->_M_dataplus)._M_p & 0xfffffffffffffffe) + 8) != 0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031ba20;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031ba26;
          }
          break;
        case 0x21:
          if (*(int *)&(str->_M_dataplus)._M_p != 0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            uVar8 = *(uint *)&(str->_M_dataplus)._M_p;
            *pbVar9 = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031c6b4;
            *pbVar9 = (byte)uVar8 | 0x80;
            pbVar9[1] = (byte)(uVar8 >> 7);
            local_b0.ptr = pbVar9 + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)pbVar9[1];
              uVar8 = uVar8 >> 7;
              do {
                local_b0.ptr[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *local_b0.ptr = (byte)uVar6;
                local_b0.ptr = local_b0.ptr + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
          }
          break;
        case 0x22:
          if (*(int *)&(str->_M_dataplus)._M_p != 0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            uVar8 = *(uint *)&(str->_M_dataplus)._M_p;
            *pbVar9 = (byte)uVar8;
            if ((ulong)(long)(int)uVar8 < 0x80) goto LAB_0031c79b;
            *pbVar9 = (byte)uVar8 | 0x80;
            uVar7 = (ulong)(long)(int)uVar8 >> 7;
            pbVar9[1] = (byte)uVar7;
            local_b0.ptr = pbVar9 + 2;
            if (0x3fff < uVar8) {
              uVar11 = (ulong)pbVar9[1];
              do {
                local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                uVar5 = uVar7 >> 7;
                *local_b0.ptr = (byte)uVar5;
                local_b0.ptr = local_b0.ptr + 1;
                uVar11 = uVar5 & 0xffffffff;
                bVar3 = 0x3fff < uVar7;
                uVar7 = uVar5;
              } while (bVar3);
            }
          }
          break;
        case 0x23:
          if (*(int *)&(str->_M_dataplus)._M_p != 0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b9cf;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031b9d5;
          }
          break;
        case 0x24:
          if ((str->_M_dataplus)._M_p != (pointer)0x0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b882;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031bb8f;
          }
          break;
        case 0x25:
          if (*(int *)&(str->_M_dataplus)._M_p != 0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031ba6c;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031ba72;
          }
          break;
        case 0x26:
          if ((str->_M_dataplus)._M_p != (pointer)0x0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b8b9;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031b8bf;
          }
          break;
        case 0x29:
          if (str->_M_string_length != 0) {
            uVar8 = md->tag;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b6c0;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031ba32;
          }
          break;
        case 0x2a:
          RepeatedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x2b:
          RepeatedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x2c:
          RepeatedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x2d:
          RepeatedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x2e:
          RepeatedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x2f:
          RepeatedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x30:
          RepeatedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x31:
          RepeatedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x32:
        case 0x35:
        case 0x3e:
          RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x33:
          RepeatedFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x34:
          RepeatedFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x36:
          RepeatedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x37:
          RepeatedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x38:
          RepeatedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x39:
          RepeatedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x3a:
          RepeatedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x3b:
          RepeatedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x3f:
          PackedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>(str,md,&local_b0)
          ;
          break;
        case 0x40:
          PackedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>(str,md,&local_b0)
          ;
          break;
        case 0x41:
          PackedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>(str,md,&local_b0)
          ;
          break;
        case 0x42:
          PackedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>(str,md,&local_b0)
          ;
          break;
        case 0x43:
          PackedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>(str,md,&local_b0)
          ;
          break;
        case 0x44:
          PackedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>(str,md,&local_b0)
          ;
          break;
        case 0x45:
          PackedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>(str,md,&local_b0)
          ;
          break;
        case 0x46:
          PackedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>(str,md,&local_b0)
          ;
          break;
        case 0x47:
        case 0x48:
        case 0x49:
        case 0x4a:
        case 0x53:
          PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>(str,md,&local_b0)
          ;
          break;
        case 0x4b:
          PackedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x4c:
          PackedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x4d:
          PackedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x4e:
          PackedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x4f:
          PackedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x50:
          PackedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                    (str,md,&local_b0);
          break;
        case 0x54:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
LAB_0031bb89:
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            goto LAB_0031bb8f;
          }
          break;
        case 0x55:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
LAB_0031b630:
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            goto LAB_0031b9d5;
          }
          break;
        case 0x56:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            pcVar2 = (str->_M_dataplus)._M_p;
            *pbVar9 = (byte)pcVar2;
            if (pcVar2 < (pointer)0x80) goto LAB_0031c6b4;
            *pbVar9 = (byte)pcVar2 | 0x80;
            pbVar9[1] = (byte)((ulong)pcVar2 >> 7);
            local_b0.ptr = pbVar9 + 2;
            if ((pointer)0x3fff < pcVar2) {
              uVar11 = (ulong)pbVar9[1];
              uVar7 = (ulong)pcVar2 >> 7;
              do {
                local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                uVar5 = uVar7 >> 7;
                *local_b0.ptr = (byte)uVar5;
                local_b0.ptr = local_b0.ptr + 1;
                uVar11 = uVar5 & 0xffffffff;
                bVar3 = 0x3fff < uVar7;
                uVar7 = uVar5;
              } while (bVar3);
            }
          }
          break;
        case 0x57:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            pcVar2 = (str->_M_dataplus)._M_p;
            *pbVar9 = (byte)pcVar2;
            if (pcVar2 < (pointer)0x80) goto LAB_0031c6b4;
            *pbVar9 = (byte)pcVar2 | 0x80;
            pbVar9[1] = (byte)((ulong)pcVar2 >> 7);
            local_b0.ptr = pbVar9 + 2;
            if ((pointer)0x3fff < pcVar2) {
              uVar11 = (ulong)pbVar9[1];
              uVar7 = (ulong)pcVar2 >> 7;
              do {
                local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                uVar5 = uVar7 >> 7;
                *local_b0.ptr = (byte)uVar5;
                local_b0.ptr = local_b0.ptr + 1;
                uVar11 = uVar5 & 0xffffffff;
                bVar3 = 0x3fff < uVar7;
                uVar7 = uVar5;
              } while (bVar3);
            }
          }
          break;
        case 0x58:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            uVar8 = *(uint *)&(str->_M_dataplus)._M_p;
            *pbVar9 = (byte)uVar8;
            if ((ulong)(long)(int)uVar8 < 0x80) goto LAB_0031c79b;
            *pbVar9 = (byte)uVar8 | 0x80;
            uVar7 = (ulong)(long)(int)uVar8 >> 7;
            pbVar9[1] = (byte)uVar7;
            local_b0.ptr = pbVar9 + 2;
            if (0x3fff < uVar8) {
              uVar11 = (ulong)pbVar9[1];
              do {
                local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                uVar5 = uVar7 >> 7;
                *local_b0.ptr = (byte)uVar5;
                local_b0.ptr = local_b0.ptr + 1;
                uVar11 = uVar5 & 0xffffffff;
                bVar3 = 0x3fff < uVar7;
                uVar7 = uVar5;
              } while (bVar3);
            }
          }
          break;
        case 0x59:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031bb89;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031bb8f;
          }
          break;
        case 0x5a:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b630;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031b9d5;
          }
          break;
        case 0x5b:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            goto LAB_0031b114;
          }
          break;
        case 0x5c:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
LAB_0031aec4:
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            goto LAB_0031ba26;
          }
          break;
        case 0x5d:
          if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_0031b15d;
          break;
        case 0x5e:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            local_b0.ptr = pbVar9;
            SerializeMessageTo<google::protobuf::internal::ArrayOutput>
                      ((MessageLite *)(str->_M_dataplus)._M_p,md->ptr,&local_b0);
          }
          break;
        case 0x5f:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031aec4;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031ba26;
          }
          break;
        case 0x60:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            uVar8 = *(uint *)&(str->_M_dataplus)._M_p;
            *pbVar9 = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031c6b4;
            *pbVar9 = (byte)uVar8 | 0x80;
            pbVar9[1] = (byte)(uVar8 >> 7);
            local_b0.ptr = pbVar9 + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)pbVar9[1];
              uVar8 = uVar8 >> 7;
              do {
                local_b0.ptr[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *local_b0.ptr = (byte)uVar6;
                local_b0.ptr = local_b0.ptr + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
          }
          break;
        case 0x61:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            uVar8 = *(uint *)&(str->_M_dataplus)._M_p;
            *pbVar9 = (byte)uVar8;
            if ((ulong)(long)(int)uVar8 < 0x80) goto LAB_0031c79b;
            *pbVar9 = (byte)uVar8 | 0x80;
            uVar7 = (ulong)(long)(int)uVar8 >> 7;
            pbVar9[1] = (byte)uVar7;
            local_b0.ptr = pbVar9 + 2;
            if (0x3fff < uVar8) {
              uVar11 = (ulong)pbVar9[1];
              do {
                local_b0.ptr[-1] = (byte)uVar11 | 0x80;
                uVar5 = uVar7 >> 7;
                *local_b0.ptr = (byte)uVar5;
                local_b0.ptr = local_b0.ptr + 1;
                uVar11 = uVar5 & 0xffffffff;
                bVar3 = 0x3fff < uVar7;
                uVar7 = uVar5;
              } while (bVar3);
            }
          }
          break;
        case 0x62:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031b630;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031b9d5;
          }
          break;
        case 99:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) goto LAB_0031bb89;
            *local_b0.ptr = (byte)uVar8 | 0x80;
            local_b0.ptr[1] = (byte)(uVar8 >> 7);
            pbVar9 = local_b0.ptr + 2;
            if (0x3fff < uVar8) {
              uVar6 = (uint)local_b0.ptr[1];
              uVar8 = uVar8 >> 7;
              do {
                pbVar9[-1] = (byte)uVar6 | 0x80;
                uVar6 = uVar8 >> 7;
                *pbVar9 = (byte)uVar6;
                pbVar9 = pbVar9 + 1;
                bVar3 = 0x3fff < uVar8;
                uVar8 = uVar6;
              } while (bVar3);
            }
            goto LAB_0031bb8f;
          }
          break;
        case 100:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            goto LAB_0031ba72;
          }
          break;
        case 0x65:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            goto LAB_0031b8bf;
          }
          break;
        case 0x68:
          uVar8 = md->tag;
          if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
            str = (string *)(str->_M_dataplus)._M_p;
            *local_b0.ptr = (byte)uVar8;
            if (uVar8 < 0x80) {
              pbVar9 = local_b0.ptr + 1;
            }
            else {
              *local_b0.ptr = (byte)uVar8 | 0x80;
              local_b0.ptr[1] = (byte)(uVar8 >> 7);
              pbVar9 = local_b0.ptr + 2;
              if (0x3fff < uVar8) {
                uVar6 = (uint)local_b0.ptr[1];
                uVar8 = uVar8 >> 7;
                do {
                  pbVar9[-1] = (byte)uVar6 | 0x80;
                  uVar6 = uVar8 >> 7;
                  *pbVar9 = (byte)uVar6;
                  pbVar9 = pbVar9 + 1;
                  bVar3 = 0x3fff < uVar8;
                  uVar8 = uVar6;
                } while (bVar3);
              }
            }
            goto LAB_0031ba32;
          }
          break;
        case 0x69:
          io::ArrayOutputStream::ArrayOutputStream(&local_50,local_b0.ptr,0x7fffffff,-1);
          io::CodedOutputStream::CodedOutputStream
                    (&local_a0,&local_50.super_ZeroCopyOutputStream,true);
          local_a0.impl_.is_serialization_deterministic_ = is_deterministic;
          (*(code *)md->ptr)(base,md->offset,md->tag,md->has_offset);
          iVar4 = io::EpsCopyOutputStream::ByteCount(&local_a0.impl_,local_a0.cur_);
          local_b0.ptr = local_b0.ptr + ((int)iVar4 - (int)local_a0.start_count_);
          io::CodedOutputStream::~CodedOutputStream(&local_a0);
        }
      }
      else {
switchD_0031a8eb_caseD_12:
        SerializeNotImplemented(uVar8);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)num_fields);
  }
  return local_b0.ptr;
}

Assistant:

uint8_t* SerializeInternalToArray(const uint8_t* base,
                                  const FieldMetadata* field_metadata_table,
                                  int32_t num_fields, bool is_deterministic,
                                  uint8_t* buffer) {
  ArrayOutput array_output = {buffer, is_deterministic};
  ArrayOutput* output = &array_output;
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8_t* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      SERIALIZERS_FOR_TYPE(FieldMetadata::kInlinedType);
      // Special cases
      case FieldMetadata::kSpecial: {
        io::ArrayOutputStream array_stream(array_output.ptr, INT_MAX);
        io::CodedOutputStream output_stream(&array_stream);
        output_stream.SetSerializationDeterministic(is_deterministic);
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, &output_stream);
        array_output.ptr += output_stream.ByteCount();
      } break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
  return array_output.ptr;
}